

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined8 in_RAX;
  GLFWmonitor **ppGVar6;
  undefined8 *puVar7;
  GLFWwindow *pGVar8;
  GLFWmonitor *monitor;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  undefined8 uStack_38;
  int monitor_count;
  
  iVar5 = 1;
  bVar1 = false;
  uStack_38 = in_RAX;
  bVar3 = false;
  while( true ) {
    while( true ) {
      do {
        bVar2 = bVar3;
        iVar4 = getopt(argc,argv,"afhn");
        bVar3 = true;
      } while (iVar4 == 0x61);
      if (iVar4 != 0x66) break;
      bVar1 = true;
      bVar3 = bVar2;
    }
    if (iVar4 != 0x6e) break;
    iVar5 = 0;
    bVar3 = bVar2;
  }
  if (iVar4 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar4 = glfwInit();
    if (iVar4 != 0) {
      glfwWindowHint(0x20006,iVar5);
      if (bVar2 && bVar1) {
        ppGVar6 = glfwGetMonitors(&monitor_count);
        uVar12 = monitor_count;
        puVar7 = (undefined8 *)calloc((long)monitor_count,8);
        iVar5 = uVar12;
        for (lVar13 = 0; lVar13 < iVar5; lVar13 = lVar13 + 1) {
          pGVar8 = create_window(ppGVar6[lVar13]);
          puVar7[lVar13] = pGVar8;
          iVar5 = monitor_count;
        }
      }
      else {
        if (bVar1) {
          monitor = glfwGetPrimaryMonitor();
        }
        else {
          monitor = (GLFWmonitor *)0x0;
        }
        puVar7 = (undefined8 *)calloc(1,8);
        pGVar8 = create_window(monitor);
        *puVar7 = pGVar8;
        uVar12 = 1;
      }
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        glfwSetKeyCallback((GLFWwindow *)puVar7[uVar10],key_callback);
        glfwSetFramebufferSizeCallback((GLFWwindow *)puVar7[uVar10],framebuffer_size_callback);
        glfwSetWindowSizeCallback((GLFWwindow *)puVar7[uVar10],window_size_callback);
        glfwSetWindowFocusCallback((GLFWwindow *)puVar7[uVar10],window_focus_callback);
        glfwSetWindowIconifyCallback((GLFWwindow *)puVar7[uVar10],window_iconify_callback);
        glfwSetWindowRefreshCallback((GLFWwindow *)puVar7[uVar10],window_refresh_callback);
        window_refresh_callback((GLFWwindow *)puVar7[uVar10]);
        iVar5 = glfwGetWindowAttrib((GLFWwindow *)puVar7[uVar10],0x20002);
        pcVar11 = "iconified";
        if (iVar5 == 0) {
          pcVar11 = "restored";
        }
        iVar5 = glfwGetWindowAttrib((GLFWwindow *)puVar7[uVar10],0x20001);
        pcVar9 = "focused";
        if (iVar5 == 0) {
          pcVar9 = "defocused";
        }
        printf("Window is %s and %s\n",pcVar11,pcVar9);
      }
      do {
        glfwPollEvents();
        uVar10 = 0;
        while (uVar12 != uVar10) {
          iVar5 = glfwWindowShouldClose((GLFWwindow *)puVar7[uVar10]);
          uVar10 = uVar10 + 1;
          if (iVar5 != 0) {
            glfwTerminate();
            goto LAB_00106e3a;
          }
        }
        fflush(_stdout);
      } while( true );
    }
  }
  else {
    if (iVar4 == 0x68) {
      usage();
LAB_00106e3a:
      exit(0);
    }
    usage();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, window_count;
    GLboolean auto_iconify = GL_TRUE, fullscreen = GL_FALSE, all_monitors = GL_FALSE;
    GLFWwindow** windows;

    while ((ch = getopt(argc, argv, "afhn")) != -1)
    {
        switch (ch)
        {
            case 'a':
                all_monitors = GL_TRUE;
                break;

            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GL_TRUE;
                break;

            case 'n':
                auto_iconify = GL_FALSE;
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_AUTO_ICONIFY, auto_iconify);

    if (fullscreen && all_monitors)
    {
        int monitor_count;
        GLFWmonitor** monitors = glfwGetMonitors(&monitor_count);

        window_count = monitor_count;
        windows = calloc(window_count, sizeof(GLFWwindow*));

        for (i = 0;  i < monitor_count;  i++)
        {
            windows[i] = create_window(monitors[i]);
            if (!windows[i])
                break;
        }
    }
    else
    {
        GLFWmonitor* monitor = NULL;

        if (fullscreen)
            monitor = glfwGetPrimaryMonitor();

        window_count = 1;
        windows = calloc(window_count, sizeof(GLFWwindow*));
        windows[0] = create_window(monitor);
    }

    for (i = 0;  i < window_count;  i++)
    {
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetWindowSizeCallback(windows[i], window_size_callback);
        glfwSetWindowFocusCallback(windows[i], window_focus_callback);
        glfwSetWindowIconifyCallback(windows[i], window_iconify_callback);
        glfwSetWindowRefreshCallback(windows[i], window_refresh_callback);

        window_refresh_callback(windows[i]);

        printf("Window is %s and %s\n",
            glfwGetWindowAttrib(windows[i], GLFW_ICONIFIED) ? "iconified" : "restored",
            glfwGetWindowAttrib(windows[i], GLFW_FOCUSED) ? "focused" : "defocused");
    }

    for (;;)
    {
        glfwPollEvents();

        for (i = 0;  i < window_count;  i++)
        {
            if (glfwWindowShouldClose(windows[i]))
                break;
        }

        if (i < window_count)
            break;

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}